

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

void hydro_random_buf_deterministic(void *out,size_t out_len,uint8_t *seed)

{
  uchar *dst;
  ulong uVar1;
  undefined8 *puVar2;
  uchar *dst_2;
  uchar *src;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  
  local_48 = 0;
  uStack_40 = 0;
  uStack_38 = 0;
  uStack_30 = 0;
  local_58 = 0x3635326762726407;
  uStack_50 = out_len;
  gimli_core_u8((uint8_t *)&local_58,'\x01');
  local_58._0_4_ = (uint)local_58 ^ *(uint *)seed;
  local_58._4_4_ = local_58._4_4_ ^ *(uint *)(seed + 4);
  uStack_50._0_4_ = (uint)uStack_50 ^ *(uint *)(seed + 8);
  uStack_50._4_4_ = uStack_50._4_4_ ^ *(uint *)(seed + 0xc);
  gimli_core_u8((uint8_t *)&local_58,'\x02');
  local_58 = CONCAT44(local_58._4_4_ ^ *(uint *)(seed + 0x14),
                      (uint)local_58 ^ *(uint *)(seed + 0x10));
  uStack_50 = CONCAT44(uStack_50._4_4_ ^ *(uint *)(seed + 0x1c),
                       (uint)uStack_50 ^ *(uint *)(seed + 0x18));
  gimli_core_u8((uint8_t *)&local_58,'\x02');
  if (out_len < 0x10) {
    uVar1 = 0;
  }
  else {
    uVar1 = out_len >> 4;
    puVar2 = (undefined8 *)out;
    do {
      gimli_core_u8((uint8_t *)&local_58,'\0');
      *puVar2 = local_58;
      puVar2[1] = uStack_50;
      puVar2 = puVar2 + 2;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
    uVar1 = out_len & 0xfffffffffffffff0;
  }
  if ((out_len & 0xf) != 0) {
    gimli_core_u8((uint8_t *)&local_58,'\0');
    memcpy((void *)((long)out + uVar1),&local_58,out_len & 0xf);
  }
  return;
}

Assistant:

void
hydro_random_buf_deterministic(void *out, size_t out_len,
                               const uint8_t seed[hydro_random_SEEDBYTES])
{
    static const uint8_t             prefix[] = { 7, 'd', 'r', 'b', 'g', '2', '5', '6' };
    _hydro_attr_aligned_(16) uint8_t state[gimli_BLOCKBYTES];
    uint8_t                         *p = (uint8_t *) out;
    size_t                           i;
    size_t                           leftover;

    mem_zero(state, gimli_BLOCKBYTES);
    COMPILER_ASSERT(sizeof prefix + 8 <= gimli_RATE);
    memcpy(state, prefix, sizeof prefix);
    STORE64_LE(state + sizeof prefix, (uint64_t) out_len);
    gimli_core_u8(state, 1);
    COMPILER_ASSERT(hydro_random_SEEDBYTES == gimli_RATE * 2);
    mem_xor(state, seed, gimli_RATE);
    gimli_core_u8(state, 2);
    mem_xor(state, seed + gimli_RATE, gimli_RATE);
    gimli_core_u8(state, 2);
    for (i = 0; i < out_len / gimli_RATE; i++) {
        gimli_core_u8(state, 0);
        memcpy(p + i * gimli_RATE, state, gimli_RATE);
    }
    leftover = out_len % gimli_RATE;
    if (leftover != 0) {
        gimli_core_u8(state, 0);
        mem_cpy(p + i * gimli_RATE, state, leftover);
    }
}